

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsQueryExecuteAsync(HelicsQuery query,HelicsFederate fed,HelicsError *err)

{
  string_view queryStr;
  bool bVar1;
  QueryObject *pQVar2;
  HelicsSequencingModes in_stack_00000014;
  Federate *in_stack_00000018;
  size_t in_stack_00000020;
  Federate *in_stack_00000028;
  undefined1 in_stack_00000030 [16];
  undefined1 in_stack_00000040 [16];
  HelicsSequencingModes in_stack_00000060;
  shared_ptr<helics::Federate> fedObj;
  QueryObject *queryObj;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  element_type *in_stack_ffffffffffffff70;
  HelicsQuery in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff80 [16];
  uint local_5c;
  uint local_44;
  
  pQVar2 = anon_unknown.dwarf_1a6d0::getQueryObj
                     (in_stack_ffffffffffffff78,(HelicsError *)in_stack_ffffffffffffff70);
  if (pQVar2 != (QueryObject *)0x0) {
    getFedSharedPtr(in_stack_ffffffffffffff80._8_8_,in_stack_ffffffffffffff80._0_8_);
    bVar1 = std::operator==((shared_ptr<helics::Federate> *)in_stack_ffffffffffffff70,
                            (nullptr_t)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                           );
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff70,
                 (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    else {
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1a304f);
      if (bVar1) {
        std::__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a3062);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff70);
        queryStr._M_str = (char *)in_stack_00000028;
        queryStr._M_len = in_stack_00000020;
        helics::Federate::queryAsync(in_stack_00000018,queryStr,in_stack_00000014);
        (pQVar2->asyncIndexCode).ivalue = local_44;
      }
      else {
        in_stack_ffffffffffffff70 =
             std::__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a3100);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff70);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff70);
        in_stack_ffffffffffffff68 = 0;
        helics::Federate::queryAsync
                  (in_stack_00000028,(string_view)in_stack_00000040,(string_view)in_stack_00000030,
                   in_stack_00000060);
        (pQVar2->asyncIndexCode).ivalue = local_5c;
      }
      pQVar2->activeAsync = true;
      std::shared_ptr<helics::Federate>::operator=
                ((shared_ptr<helics::Federate> *)in_stack_ffffffffffffff70,
                 (shared_ptr<helics::Federate> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1a30ee);
  }
  return;
}

Assistant:

void helicsQueryExecuteAsync(HelicsQuery query, HelicsFederate fed, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return;
    }
    auto fedObj = getFedSharedPtr(fed, err);
    if (fedObj == nullptr) {
        queryObj->response = invalidFedObConst;
        return;
    }
    try {
        if (queryObj->target.empty()) {
            queryObj->asyncIndexCode = fedObj->queryAsync(queryObj->query);
        } else {
            queryObj->asyncIndexCode = fedObj->queryAsync(queryObj->target, queryObj->query);
        }
        queryObj->activeAsync = true;
        queryObj->activeFed = fedObj;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}